

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O1

void skipNonNewlineWhitespace(char **cur,char *end)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*cur;
  do {
    if (pbVar3 == (byte *)end) {
      return;
    }
    bVar1 = *pbVar3;
    if ((0x20 < (ulong)bVar1) || (pbVar2 = pbVar3, (0x100002200U >> ((ulong)bVar1 & 0x3f) & 1) == 0)
       ) {
      if (bVar1 != 0x5c) {
        return;
      }
      pbVar2 = pbVar3 + 1;
      if ((pbVar2 == (byte *)end) || (*pbVar2 != 10)) {
        pbVar3 = pbVar3 + 2;
        if (end <= pbVar3) {
          return;
        }
        if (*pbVar2 != 0xd) {
          return;
        }
        pbVar2 = pbVar3;
        if (*pbVar3 != 10) {
          return;
        }
      }
      *cur = (char *)pbVar2;
    }
    pbVar3 = pbVar2 + 1;
    *cur = (char *)pbVar3;
  } while( true );
}

Assistant:

static void skipNonNewlineWhitespace(const char*& cur, const char* end) {
  for (; cur != end; ++cur) {
    int c = *cur;

    // Skip regular whitespace.
    if (c == ' ' || c == '\t' || c == '\r')
      continue;

    // If this is an escaped newline, also skip it.
    if (c == '\\' && cur + 1 != end && cur[1] == '\n') {
      ++cur;
      continue;
    }

    // Also skip \r\n newlines
    if (c == '\\' && cur + 2 < end && cur[1] == '\r' && cur[2] == '\n') {
      cur += 2;
      continue;
    }

    // Otherwise, stop scanning.
    break;
  }
}